

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O3

int libebml::CodedValueLengthSigned(int64 Length,int CodedSize,binary *OutBuffer)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar2 = Length + 0x3fU;
  if ((((0x7e < Length + 0x3fU) && (uVar2 = Length + 0x1fffU, 0x3ffe < Length + 0x1fffU)) &&
      (uVar2 = Length + 0xfffffU, 0x1ffffe < Length + 0xfffffU)) &&
     (uVar2 = Length, Length + 0x7ffffffU < 0xfffffff)) {
    uVar2 = Length + 0x7ffffffU;
  }
  bVar3 = (byte)(1 << (8U - (char)CodedSize & 0x1f));
  *OutBuffer = bVar3;
  uVar4 = 0xff;
  if (1 < CodedSize) {
    lVar1 = (ulong)(uint)CodedSize - 1;
    uVar4 = 0xff;
    do {
      OutBuffer[lVar1] = (binary)uVar2;
      uVar2 = uVar2 >> 8;
      uVar4 = uVar4 >> 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    bVar3 = *OutBuffer;
  }
  *OutBuffer = (byte)uVar4 & (byte)uVar2 | bVar3;
  return CodedSize;
}

Assistant:

int CodedValueLengthSigned(int64 Length, int CodedSize, binary * OutBuffer)
{
  if (Length > -64 && Length < 64) // 2^6
    Length += 63;
  else if (Length > -8192 && Length < 8192) // 2^13
    Length += 8191;
  else if (Length > -1048576L && Length < 1048576L) // 2^20
    Length += 1048575L;
  else if (Length > -134217728L && Length < 134217728L) // 2^27
    Length += 134217727L;

  return CodedValueLength(Length, CodedSize, OutBuffer);
}